

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldf_process.cpp
# Opt level: O3

void __thiscall ldf::print(ldf *this)

{
  undefined8 in_RAX;
  long *plVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  _Self __tmp;
  undefined8 uStack_38;
  
  p_Var3 = (this->layer_definition)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Printing layer definition information.",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"================= Start ================",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  for (; (_Rb_tree_header *)p_Var3 != &(this->layer_definition)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Layer number = ",0xf);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,p_Var3[1]._M_color);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Name         = ",0xf);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)p_Var3[1]._M_parent,(long)p_Var3[1]._M_left);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Thickness    = ",0xf);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var3[2]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Order        = ",0xf);
    plVar1 = (long *)std::ostream::operator<<
                               ((ostream *)&std::cout,*(int *)((long)&p_Var3[2]._M_parent + 4));
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mask         = ",0xf);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var3[2]._M_left);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Film type    = ",0xf);
    uStack_38 = CONCAT17(*(undefined1 *)((long)&p_Var3[2]._M_left + 4),(undefined7)uStack_38);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Colour       = ",0xf);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var3[2]._M_right);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"----------------------------------------",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"================== End =================",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void ldf::print()
{
  auto it = layer_definition.begin();
  cout << "Printing layer definition information." << endl;
  cout << "================= Start ================" << endl;
  while (it != layer_definition.end()) {
    cout << "Layer number = " << it->first << endl;
    cout << "Name         = " << it->second.name << endl;
    cout << "Thickness    = " << it->second.thickness << endl;
    cout << "Order        = " << it->second.order << endl;
    cout << "Mask         = " << it->second.mask << endl;
    cout << "Film type    = " << it->second.film_type << endl;
    cout << "Colour       = " << it->second.colour << endl;
    cout << "----------------------------------------" << endl;
    it++;
  }
  cout << "================== End =================" << endl;
}